

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_wait_release.h
# Opt level: O0

void __kmp_wait_template<kmp_flag_oncore>
               (kmp_info_t *this_thr,kmp_flag_oncore *flag,int final_spin,void *itt_sync_obj)

{
  bool bVar1;
  uint uVar2;
  long lVar3;
  kmp_info_t *pkVar4;
  kmp_flag<unsigned_long_long> *in_RSI;
  long in_RDI;
  kmp_task_team_t *task_team;
  int in_pool;
  int sync_iters;
  kmp_uint64 hibernate_goal;
  kmp_uint64 poll_count;
  int oversubscribed;
  int tasks_completed;
  int th_gtid;
  kmp_uint32 hibernate;
  kmp_uint32 spins;
  flag_t_conflict *spin;
  int in_stack_ffffffffffffff8c;
  kmp_info_t *in_stack_ffffffffffffff90;
  kmp_info_t *this;
  int *thread_finished;
  uint in_stack_ffffffffffffffa0;
  int gtid;
  kmp_info_t *in_stack_ffffffffffffffa8;
  kmp_flag_oncore *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  kmp_int32 is_constrained;
  kmp_uint32 local_34;
  unsigned_long_long *local_30;
  
  local_30 = kmp_flag<unsigned_long_long>::get(in_RSI);
  is_constrained = 0;
  gtid = 0;
  if ((__kmp_itt_fsync_prepare_ptr__3_0 != (undefined1 *)0x0) &&
     (local_30 == (unsigned_long_long *)0x0)) {
    local_30 = (unsigned_long_long *)0x0;
  }
  bVar1 = kmp_flag_oncore::done_check((kmp_flag_oncore *)&in_stack_ffffffffffffff90->th);
  if (bVar1) {
    if ((__kmp_itt_prepare_delay <= gtid) &&
       (__kmp_itt_fsync_acquired_ptr__3_0 != (undefined1 *)0x0)) {
      (*(code *)__kmp_itt_fsync_acquired_ptr__3_0)(local_30);
    }
  }
  else {
    local_34 = __kmp_yield_init;
    if (__kmp_dflt_blocktime != 0x7fffffff) {
      lVar3 = __kmp_hardware_timestamp();
      in_stack_ffffffffffffffa8 = (kmp_info_t *)(lVar3 + *(long *)(in_RDI + 0x88));
      in_stack_ffffffffffffffb0 = (kmp_flag_oncore *)0x0;
    }
    uVar2 = (uint)(__kmp_avail_proc < __kmp_nth);
    while (bVar1 = kmp_flag_oncore::notdone_check
                             ((kmp_flag_oncore *)CONCAT44(uVar2,in_stack_ffffffffffffffb8)), bVar1)
    {
      thread_finished = (int *)0x0;
      this = in_stack_ffffffffffffffa8;
      if (__kmp_tasking_mode != tskm_immediate_exec) {
        thread_finished = *(int **)(in_RDI + 0x170);
        if (thread_finished == (int *)0x0) {
          *(undefined4 *)(in_RDI + 0x198) = 1;
        }
        else if (thread_finished[0x30] == 0) {
          *(undefined8 *)(in_RDI + 0x170) = 0;
          *(undefined4 *)(in_RDI + 0x198) = 1;
        }
        else if (thread_finished[0x14] == 1) {
          kmp_flag_oncore::execute_tasks
                    (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,gtid,
                     in_stack_ffffffffffffffa0,thread_finished,in_stack_ffffffffffffff90,
                     is_constrained);
          this = in_stack_ffffffffffffffa8;
        }
        else {
          *(undefined4 *)(in_RDI + 0x198) = 1;
        }
      }
      if ((((__kmp_itt_fsync_prepare_ptr__3_0 != (undefined1 *)0x0) &&
           (gtid < __kmp_itt_prepare_delay)) && (gtid = gtid + 1, __kmp_itt_prepare_delay <= gtid))
         && (__kmp_itt_fsync_prepare_ptr__3_0 != (undefined1 *)0x0)) {
        (*(code *)__kmp_itt_fsync_prepare_ptr__3_0)(local_30);
      }
      if (__kmp_global.g.g_done != 0) {
        if (__kmp_global.g.g_abort != 0) {
          __kmp_abort_thread();
        }
        break;
      }
      if (uVar2 == 0) {
        __kmp_x86_pause();
        local_34 = local_34 - 2;
        if (local_34 == 0) {
          __kmp_yield((int)((ulong)in_stack_ffffffffffffff90 >> 0x20));
          local_34 = __kmp_yield_next;
        }
      }
      else {
        __kmp_x86_pause();
        __kmp_yield((int)((ulong)in_stack_ffffffffffffff90 >> 0x20));
      }
      in_stack_ffffffffffffffa0 = (uint)(*(int *)(in_RDI + 0x60) != 0);
      if (in_stack_ffffffffffffffa0 != (*(char *)(in_RDI + 0x19c) != '\0')) {
        if (in_stack_ffffffffffffffa0 == 0) {
          LOCK();
          __kmp_thread_pool_active_nth = __kmp_thread_pool_active_nth + -1;
          UNLOCK();
          *(undefined1 *)(in_RDI + 0x19c) = 0;
        }
        else {
          LOCK();
          __kmp_thread_pool_active_nth = __kmp_thread_pool_active_nth + 1;
          UNLOCK();
          *(undefined1 *)(in_RDI + 0x19c) = 1;
        }
      }
      in_stack_ffffffffffffffa8 = this;
      if (((__kmp_dflt_blocktime != 0x7fffffff) &&
          ((thread_finished == (int *)0x0 || (thread_finished[0x14] == 0)))) &&
         (pkVar4 = (kmp_info_t *)__kmp_hardware_timestamp(), in_stack_ffffffffffffff90 = this,
         this <= pkVar4)) {
        kmp_flag_oncore::suspend((kmp_flag_oncore *)&this->th,in_stack_ffffffffffffff8c);
        if (__kmp_global.g.g_done != 0) {
          if (__kmp_global.g.g_abort != 0) {
            __kmp_abort_thread();
          }
          break;
        }
        in_stack_ffffffffffffff90 = this;
        if ((__kmp_tasking_mode != tskm_immediate_exec) && (*(int *)(in_RDI + 0x198) == 1)) {
          *(undefined4 *)(in_RDI + 0x198) = 0;
        }
      }
    }
    if ((__kmp_itt_prepare_delay <= gtid) &&
       (__kmp_itt_fsync_acquired_ptr__3_0 != (undefined1 *)0x0)) {
      (*(code *)__kmp_itt_fsync_acquired_ptr__3_0)(local_30);
    }
  }
  return;
}

Assistant:

static inline void
__kmp_wait_template(kmp_info_t *this_thr, C *flag,
                    int final_spin USE_ITT_BUILD_ARG(void *itt_sync_obj)) {
  // NOTE: We may not belong to a team at this point.
  volatile typename C::flag_t *spin = flag->get();
  kmp_uint32 spins;
  kmp_uint32 hibernate;
  int th_gtid;
  int tasks_completed = FALSE;
  int oversubscribed;
#if !KMP_USE_MONITOR
  kmp_uint64 poll_count;
  kmp_uint64 hibernate_goal;
#endif

  KMP_FSYNC_SPIN_INIT(spin, NULL);
  if (flag->done_check()) {
    KMP_FSYNC_SPIN_ACQUIRED(CCAST(typename C::flag_t *, spin));
    return;
  }
  th_gtid = this_thr->th.th_info.ds.ds_gtid;
  KA_TRACE(20,
           ("__kmp_wait_sleep: T#%d waiting for flag(%p)\n", th_gtid, flag));
#if KMP_STATS_ENABLED
  stats_state_e thread_state = KMP_GET_THREAD_STATE();
#endif

/* OMPT Behavior:
THIS function is called from
  __kmp_barrier (2 times)  (implicit or explicit barrier in parallel regions)
            these have join / fork behavior

       In these cases, we don't change the state or trigger events in THIS
function.
       Events are triggered in the calling code (__kmp_barrier):

                state := omp_state_overhead
            barrier-begin
            barrier-wait-begin
                state := omp_state_wait_barrier
          call join-barrier-implementation (finally arrive here)
          {}
          call fork-barrier-implementation (finally arrive here)
          {}
                state := omp_state_overhead
            barrier-wait-end
            barrier-end
                state := omp_state_work_parallel


  __kmp_fork_barrier  (after thread creation, before executing implicit task)
          call fork-barrier-implementation (finally arrive here)
          {} // worker arrive here with state = omp_state_idle


  __kmp_join_barrier  (implicit barrier at end of parallel region)
                state := omp_state_barrier_implicit
            barrier-begin
            barrier-wait-begin
          call join-barrier-implementation (finally arrive here
final_spin=FALSE)
          {
          }
  __kmp_fork_barrier  (implicit barrier at end of parallel region)
          call fork-barrier-implementation (finally arrive here final_spin=TRUE)

       Worker after task-team is finished:
            barrier-wait-end
            barrier-end
            implicit-task-end
            idle-begin
                state := omp_state_idle

       Before leaving, if state = omp_state_idle
            idle-end
                state := omp_state_overhead
*/
#if OMPT_SUPPORT
  omp_state_t ompt_entry_state;
  ompt_data_t *pId = NULL;
  ompt_data_t *tId;
  if (ompt_enabled.enabled) {
    ompt_entry_state = this_thr->th.ompt_thread_info.state;
    if (!final_spin || ompt_entry_state != omp_state_wait_barrier_implicit ||
        KMP_MASTER_TID(this_thr->th.th_info.ds.ds_tid)) {
      ompt_lw_taskteam_t *team =
          this_thr->th.th_team->t.ompt_serialized_team_info;
      if (team) {
        pId = &(team->ompt_team_info.parallel_data);
        tId = &(team->ompt_task_info.task_data);
      } else {
        pId = OMPT_CUR_TEAM_DATA(this_thr);
        tId = OMPT_CUR_TASK_DATA(this_thr);
      }
    } else {
      pId = NULL;
      tId = &(this_thr->th.ompt_thread_info.task_data);
    }
#if OMPT_OPTIONAL
    if (ompt_entry_state == omp_state_idle) {
      if (ompt_enabled.ompt_callback_idle) {
        ompt_callbacks.ompt_callback(ompt_callback_idle)(ompt_scope_begin);
      }
    } else
#endif
        if (final_spin && (__kmp_tasking_mode == tskm_immediate_exec ||
                           this_thr->th.th_task_team == NULL)) {
      // implicit task is done. Either no taskqueue, or task-team finished
      __ompt_implicit_task_end(this_thr, ompt_entry_state, tId, pId);
    }
  }
#endif

  // Setup for waiting
  KMP_INIT_YIELD(spins);

  if (__kmp_dflt_blocktime != KMP_MAX_BLOCKTIME) {
#if KMP_USE_MONITOR
// The worker threads cannot rely on the team struct existing at this point.
// Use the bt values cached in the thread struct instead.
#ifdef KMP_ADJUST_BLOCKTIME
    if (__kmp_zero_bt && !this_thr->th.th_team_bt_set)
      // Force immediate suspend if not set by user and more threads than
      // available procs
      hibernate = 0;
    else
      hibernate = this_thr->th.th_team_bt_intervals;
#else
    hibernate = this_thr->th.th_team_bt_intervals;
#endif /* KMP_ADJUST_BLOCKTIME */

    /* If the blocktime is nonzero, we want to make sure that we spin wait for
       the entirety of the specified #intervals, plus up to one interval more.
       This increment make certain that this thread doesn't go to sleep too
       soon.  */
    if (hibernate != 0)
      hibernate++;

    // Add in the current time value.
    hibernate += TCR_4(__kmp_global.g.g_time.dt.t_value);
    KF_TRACE(20, ("__kmp_wait_sleep: T#%d now=%d, hibernate=%d, intervals=%d\n",
                  th_gtid, __kmp_global.g.g_time.dt.t_value, hibernate,
                  hibernate - __kmp_global.g.g_time.dt.t_value));
#else
    hibernate_goal = KMP_NOW() + this_thr->th.th_team_bt_intervals;
    poll_count = 0;
#endif // KMP_USE_MONITOR
  }

  oversubscribed = (TCR_4(__kmp_nth) > __kmp_avail_proc);
  KMP_MB();

  // Main wait spin loop
  while (flag->notdone_check()) {
    int in_pool;
    kmp_task_team_t *task_team = NULL;
    if (__kmp_tasking_mode != tskm_immediate_exec) {
      task_team = this_thr->th.th_task_team;
      /* If the thread's task team pointer is NULL, it means one of 3 things:
         1) A newly-created thread is first being released by
         __kmp_fork_barrier(), and its task team has not been set up yet.
         2) All tasks have been executed to completion.
         3) Tasking is off for this region.  This could be because we are in a
         serialized region (perhaps the outer one), or else tasking was manually
         disabled (KMP_TASKING=0).  */
      if (task_team != NULL) {
        if (TCR_SYNC_4(task_team->tt.tt_active)) {
          if (KMP_TASKING_ENABLED(task_team))
            flag->execute_tasks(
                this_thr, th_gtid, final_spin,
                &tasks_completed USE_ITT_BUILD_ARG(itt_sync_obj), 0);
          else
            this_thr->th.th_reap_state = KMP_SAFE_TO_REAP;
        } else {
          KMP_DEBUG_ASSERT(!KMP_MASTER_TID(this_thr->th.th_info.ds.ds_tid));
#if OMPT_SUPPORT
          // task-team is done now, other cases should be catched above
          if (final_spin && ompt_enabled.enabled)
            __ompt_implicit_task_end(this_thr, ompt_entry_state, tId, pId);
#endif
          this_thr->th.th_task_team = NULL;
          this_thr->th.th_reap_state = KMP_SAFE_TO_REAP;
        }
      } else {
        this_thr->th.th_reap_state = KMP_SAFE_TO_REAP;
      } // if
    } // if

    KMP_FSYNC_SPIN_PREPARE(CCAST(typename C::flag_t *, spin));
    if (TCR_4(__kmp_global.g.g_done)) {
      if (__kmp_global.g.g_abort)
        __kmp_abort_thread();
      break;
    }

    // If we are oversubscribed, or have waited a bit (and
    // KMP_LIBRARY=throughput), then yield
    // TODO: Should it be number of cores instead of thread contexts? Like:
    // KMP_YIELD(TCR_4(__kmp_nth) > __kmp_ncores);
    // Need performance improvement data to make the change...
    if (oversubscribed) {
      KMP_YIELD(1);
    } else {
      KMP_YIELD_SPIN(spins);
    }
    // Check if this thread was transferred from a team
    // to the thread pool (or vice-versa) while spinning.
    in_pool = !!TCR_4(this_thr->th.th_in_pool);
    if (in_pool != !!this_thr->th.th_active_in_pool) {
      if (in_pool) { // Recently transferred from team to pool
        KMP_TEST_THEN_INC32(&__kmp_thread_pool_active_nth);
        this_thr->th.th_active_in_pool = TRUE;
        /* Here, we cannot assert that:
           KMP_DEBUG_ASSERT(TCR_4(__kmp_thread_pool_active_nth) <=
           __kmp_thread_pool_nth);
           __kmp_thread_pool_nth is inc/dec'd by the master thread while the
           fork/join lock is held, whereas __kmp_thread_pool_active_nth is
           inc/dec'd asynchronously by the workers. The two can get out of sync
           for brief periods of time.  */
      } else { // Recently transferred from pool to team
        KMP_TEST_THEN_DEC32(&__kmp_thread_pool_active_nth);
        KMP_DEBUG_ASSERT(TCR_4(__kmp_thread_pool_active_nth) >= 0);
        this_thr->th.th_active_in_pool = FALSE;
      }
    }

#if KMP_STATS_ENABLED
    // Check if thread has been signalled to idle state
    // This indicates that the logical "join-barrier" has finished
    if (this_thr->th.th_stats->isIdle() &&
        KMP_GET_THREAD_STATE() == FORK_JOIN_BARRIER) {
      KMP_SET_THREAD_STATE(IDLE);
      KMP_PUSH_PARTITIONED_TIMER(OMP_idle);
    }
#endif

    // Don't suspend if KMP_BLOCKTIME is set to "infinite"
    if (__kmp_dflt_blocktime == KMP_MAX_BLOCKTIME)
      continue;

    // Don't suspend if there is a likelihood of new tasks being spawned.
    if ((task_team != NULL) && TCR_4(task_team->tt.tt_found_tasks))
      continue;

#if KMP_USE_MONITOR
    // If we have waited a bit more, fall asleep
    if (TCR_4(__kmp_global.g.g_time.dt.t_value) < hibernate)
      continue;
#else
    if (KMP_BLOCKING(hibernate_goal, poll_count++))
      continue;
#endif

    KF_TRACE(50, ("__kmp_wait_sleep: T#%d suspend time reached\n", th_gtid));
    flag->suspend(th_gtid);

    if (TCR_4(__kmp_global.g.g_done)) {
      if (__kmp_global.g.g_abort)
        __kmp_abort_thread();
      break;
    } else if (__kmp_tasking_mode != tskm_immediate_exec &&
               this_thr->th.th_reap_state == KMP_SAFE_TO_REAP) {
      this_thr->th.th_reap_state = KMP_NOT_SAFE_TO_REAP;
    }
    // TODO: If thread is done with work and times out, disband/free
  }

#if OMPT_SUPPORT
  omp_state_t ompt_exit_state = this_thr->th.ompt_thread_info.state;
  if (ompt_enabled.enabled && ompt_exit_state != omp_state_undefined) {
#if OMPT_OPTIONAL
    if (final_spin) {
      __ompt_implicit_task_end(this_thr, ompt_exit_state, tId, pId);
      ompt_exit_state = this_thr->th.ompt_thread_info.state;
    }
#endif
    if (ompt_exit_state == omp_state_idle) {
#if OMPT_OPTIONAL
      if (ompt_enabled.ompt_callback_idle) {
        ompt_callbacks.ompt_callback(ompt_callback_idle)(ompt_scope_end);
      }
#endif
      this_thr->th.ompt_thread_info.state = omp_state_overhead;
    }
  }
#endif
#if KMP_STATS_ENABLED
  // If we were put into idle state, pop that off the state stack
  if (KMP_GET_THREAD_STATE() == IDLE) {
    KMP_POP_PARTITIONED_TIMER();
    KMP_SET_THREAD_STATE(thread_state);
    this_thr->th.th_stats->resetIdleFlag();
  }
#endif

  KMP_FSYNC_SPIN_ACQUIRED(CCAST(typename C::flag_t *, spin));
}